

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O1

string * __thiscall
Corrade::Utility::Arguments::prefix_abi_cxx11_(string *__return_storage_ptr__,Arguments *this)

{
  if ((this->_prefix)._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->_prefix);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Arguments::prefix() const {
    return _prefix.empty() ? std::string{} : _prefix.substr(0, _prefix.size() - 1);
}